

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O2

void callIndirect_op(vm *v,instruction *inst)

{
  uint32 uVar1;
  
  uVar1 = popU32(&v->operandStack);
  if (uVar1 < (v->table).itemCount) {
    execFunc(v,(v->table).item[uVar1]);
    return;
  }
  fwrite("table index is too big\n",0x17,1,_stderr);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/wasm/instruction/control_inst/call_inst/call_inst.c"
                ,0x58,"void callIndirect_op(vm *, instruction *)");
}

Assistant:

void callIndirect_op(vm *v, instruction *inst) {
    type_index t_index = ((call_indirectArgs *) inst->arg)->t_index;
    uint32 index = popU32(&v->operandStack);
    if (index >= v->table.itemCount) {
        errorExit("table index is too big\n");
    }
    function_index f_index = *(v->table.item + index);
    execFunc(v, f_index);
}